

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

cf_errno_t cf_thread_attr_init(cf_thread_attr_t *attr)

{
  int iVar1;
  
  if (attr != (cf_thread_attr_t *)0x0) {
    iVar1 = pthread_attr_init((pthread_attr_t *)attr);
    return (uint)(iVar1 != 0);
  }
  return 2;
}

Assistant:

cf_errno_t cf_thread_attr_init(cf_thread_attr_t* attr) {
#ifdef CF_OS_WIN
    return CF_OK;
#else
    if(!attr) return CF_EPARAM;
    if(pthread_attr_init(attr) == 0) return CF_OK;
    else return CF_NOK;
#endif
}